

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall crnlib::mipmapped_texture::assign(mipmapped_texture *this,mip_level *pLevel)

{
  face_vec faces;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  face_vec *faces_00;
  mipmapped_texture *in_stack_ffffffffffffffc0;
  face_vec local_30 [3];
  
  faces_00 = local_30;
  uVar1 = 1;
  vector<crnlib::mip_level_*>::vector
            ((vector<crnlib::mip_level_*> *)in_stack_ffffffffffffffc0,
             (uint)((ulong)faces_00 >> 0x20),(mip_level **)CONCAT44(1,in_stack_ffffffffffffffb0));
  vector<crnlib::vector<crnlib::mip_level_*>_>::vector
            ((vector<crnlib::vector<crnlib::mip_level_*>_> *)in_stack_ffffffffffffffc0,
             (uint)((ulong)faces_00 >> 0x20),
             (vector<crnlib::mip_level_*> *)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
  vector<crnlib::mip_level_*>::~vector
            ((vector<crnlib::mip_level_*> *)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
  assign(in_stack_ffffffffffffffc0,faces_00);
  vector<crnlib::vector<crnlib::mip_level_*>_>::~vector
            ((vector<crnlib::vector<crnlib::mip_level_*>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void mipmapped_texture::assign(mip_level* pLevel) {
  face_vec faces(1, mip_ptr_vec(1, pLevel));
  assign(faces);
}